

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

int Pattern_match(Pattern *p,vector<StateP,_std::allocator<StateP>_> *stk)

{
  PType type;
  vector<StateP,_std::allocator<StateP>_> *stk_local;
  Pattern *p_local;
  
  switch(*(undefined4 *)p) {
  case 0:
    p_local._4_4_ = P_CharAny::match((P_CharAny *)p,stk);
    break;
  case 1:
    p_local._4_4_ = P_CharOut::match((P_CharOut *)p,stk);
    break;
  case 2:
    p_local._4_4_ = P_CharExact::match((P_CharExact *)p,stk);
    break;
  case 3:
    p_local._4_4_ = P_CharNegative::match((P_CharNegative *)p,stk);
    break;
  case 4:
    p_local._4_4_ = P_Sequence::match((P_Sequence *)p,stk);
    break;
  case 5:
    p_local._4_4_ = P_Alternation::match((P_Alternation *)p,stk);
    break;
  case 6:
    p_local._4_4_ = P_Assertion::match((P_Assertion *)p,stk);
    break;
  case 7:
    p_local._4_4_ = P_DirectionAlternation::match((P_DirectionAlternation *)p,stk);
    break;
  case 8:
    p_local._4_4_ = P_Teleport::match((P_Teleport *)p,stk);
    break;
  case 9:
    p_local._4_4_ = P_Terminator::match((P_Terminator *)p,stk);
    break;
  case 10:
    p_local._4_4_ = P_Jump::match((P_Jump *)p,stk);
    break;
  case 0xb:
    p_local._4_4_ = P_Quantifier::match((P_Quantifier *)p,stk);
    break;
  case 0xc:
    p_local._4_4_ = P_QReset::match((P_QReset *)p,stk);
    break;
  default:
    __assert_fail("!\"This is not supposed to happen\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/pattern.cpp"
                  ,0xc,"int Pattern_match(Pattern *, vector<StateP> &)");
  }
  return p_local._4_4_;
}

Assistant:

int Pattern_match(Pattern* p, vector<StateP>& stk) {
#define PATTERN_DISPATCH(PTYPE) case PType::PTYPE: return reinterpret_cast<PTYPE*>(p)->match(stk);
    PType type = *reinterpret_cast<PType*>(p);
    switch (type) {
        PTYPE_LIST_APPLY(PATTERN_DISPATCH)
    }
    NEVERHAPPEN
}